

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_cdef_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_U32 *write_to;
  RK_S32 RVar1;
  RK_S32 RVar2;
  undefined8 in_RAX;
  long lVar3;
  RK_U32 value;
  undefined8 uStack_38;
  
  if (((ctx->coded_lossless == 0) && (current->allow_intrabc == '\0')) &&
     (ctx->sequence_header->enable_cdef != '\0')) {
    uStack_38 = in_RAX;
    RVar1 = mpp_av1_read_unsigned(gb,2,"cdef_damping_minus_3",(RK_U32 *)((long)&uStack_38 + 4),0,3);
    if (-1 < RVar1) {
      current->cdef_damping_minus_3 = uStack_38._4_1_;
      RVar1 = 0;
      RVar2 = mpp_av1_read_unsigned(gb,2,"cdef_bits",(RK_U32 *)((long)&uStack_38 + 4),0,3);
      if (RVar2 < 0) {
LAB_001c428e:
        RVar1 = -1;
      }
      else {
        current->cdef_bits = (RK_U8)((ulong)uStack_38 >> 0x20);
        if ((uStack_38._4_4_ & 0xff) != 0x1f) {
          lVar3 = 0;
          write_to = (RK_U32 *)((long)&uStack_38 + 4);
          RVar1 = 0;
          do {
            RVar2 = mpp_av1_read_unsigned(gb,4,"cdef_y_pri_strength[i]",write_to,0,0xf);
            if (RVar2 < 0) goto LAB_001c428e;
            current->cdef_y_pri_strength[lVar3] = uStack_38._4_1_;
            RVar2 = mpp_av1_read_unsigned(gb,2,"cdef_y_sec_strength[i]",write_to,0,3);
            if (RVar2 < 0) goto LAB_001c428e;
            current->cdef_y_sec_strength[lVar3] = uStack_38._4_1_;
            if (1 < ctx->num_planes) {
              RVar2 = mpp_av1_read_unsigned(gb,4,"cdef_uv_pri_strength[i]",write_to,0,0xf);
              if (RVar2 < 0) goto LAB_001c428e;
              current->cdef_uv_pri_strength[lVar3] = uStack_38._4_1_;
              RVar2 = mpp_av1_read_unsigned(gb,2,"cdef_uv_sec_strength[i]",write_to,0,3);
              if (RVar2 < 0) goto LAB_001c428e;
              current->cdef_uv_sec_strength[lVar3] = uStack_38._4_1_;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < 1 << (current->cdef_bits & 0x1f));
        }
      }
    }
  }
  else {
    current->cdef_damping_minus_3 = '\0';
    current->cdef_bits = '\0';
    RVar1 = 0;
    current->cdef_y_pri_strength[0] = '\0';
    current->cdef_y_sec_strength[0] = '\0';
    current->cdef_uv_pri_strength[0] = '\0';
    current->cdef_uv_sec_strength[0] = '\0';
  }
  return RVar1;
}

Assistant:

static RK_S32 mpp_av1_cdef_params(AV1Context *ctx, BitReadCtx_t *gb,
                                  AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 i, err;
    if (ctx->coded_lossless || current->allow_intrabc ||
        !seq->enable_cdef) {
        infer(cdef_damping_minus_3, 0);
        infer(cdef_bits, 0);
        infer(cdef_y_pri_strength[0],  0);
        infer(cdef_y_sec_strength[0],  0);
        infer(cdef_uv_pri_strength[0], 0);
        infer(cdef_uv_sec_strength[0], 0);

        return 0;
    }

    fb(2, cdef_damping_minus_3);
    fb(2, cdef_bits);

    for (i = 0; i < (1 << current->cdef_bits); i++) {
        fbs(4, cdef_y_pri_strength[i], 1, i);
        fbs(2, cdef_y_sec_strength[i], 1, i);

        if (ctx->num_planes > 1) {
            fbs(4, cdef_uv_pri_strength[i], 1, i);
            fbs(2, cdef_uv_sec_strength[i], 1, i);
        }
    }

    return 0;
}